

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O1

void chrono::TriangleNormalsCompute
               (ChVector<int> *norm_indexes,ChVector<int> *vert_indexes,
               vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               *vertexes,
               vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *normals
               ,vector<int,_std::allocator<int>_> *accumul)

{
  int iVar1;
  int iVar2;
  pointer pCVar3;
  pointer piVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  iVar1 = vert_indexes->m_data[1];
  pCVar3 = (vertexes->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = vert_indexes->m_data[0];
  dVar11 = pCVar3[iVar1].m_data[0] - pCVar3[iVar2].m_data[0];
  dVar5 = pCVar3[iVar1].m_data[1] - pCVar3[iVar2].m_data[1];
  dVar10 = pCVar3[iVar1].m_data[2] - pCVar3[iVar2].m_data[2];
  iVar1 = vert_indexes->m_data[2];
  dVar6 = pCVar3[iVar1].m_data[0] - pCVar3[iVar2].m_data[0];
  dVar7 = pCVar3[iVar1].m_data[1] - pCVar3[iVar2].m_data[1];
  dVar8 = pCVar3[iVar1].m_data[2] - pCVar3[iVar2].m_data[2];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar5;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar8;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar7 * dVar10;
  auVar14 = vfmsub231sd_fma(auVar21,auVar14,auVar19);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar6;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar10;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar8 * dVar11;
  auVar12 = vfmsub231sd_fma(auVar20,auVar15,auVar17);
  dVar10 = auVar12._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar11;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar7;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar6 * dVar5;
  auVar15 = vfmsub231sd_fma(auVar18,auVar12,auVar16);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar10 * dVar10;
  auVar12 = vfmadd231sd_fma(auVar13,auVar14,auVar14);
  auVar12 = vfmadd231sd_fma(auVar12,auVar15,auVar15);
  if (auVar12._0_8_ < 0.0) {
    dVar11 = sqrt(auVar12._0_8_);
  }
  else {
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    dVar11 = auVar12._0_8_;
  }
  bVar9 = 2.2250738585072014e-308 <= dVar11;
  dVar11 = 1.0 / dVar11;
  dVar5 = (double)((ulong)bVar9 * (long)(dVar11 * dVar10));
  dVar10 = (double)((ulong)bVar9 * (long)(auVar14._0_8_ * dVar11) +
                   (ulong)!bVar9 * 0x3ff0000000000000);
  dVar11 = (double)((ulong)bVar9 * (long)(auVar15._0_8_ * dVar11));
  iVar1 = norm_indexes->m_data[0];
  pCVar3 = (normals->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar3[iVar1].m_data[0] = dVar10 + pCVar3[iVar1].m_data[0];
  pCVar3[iVar1].m_data[1] = dVar5 + pCVar3[iVar1].m_data[1];
  pCVar3[iVar1].m_data[2] = dVar11 + pCVar3[iVar1].m_data[2];
  iVar2 = norm_indexes->m_data[1];
  pCVar3[iVar2].m_data[0] = dVar10 + pCVar3[iVar2].m_data[0];
  pCVar3[iVar2].m_data[1] = dVar5 + pCVar3[iVar2].m_data[1];
  pCVar3[iVar2].m_data[2] = dVar11 + pCVar3[iVar2].m_data[2];
  iVar2 = norm_indexes->m_data[2];
  pCVar3[iVar2].m_data[0] = dVar10 + pCVar3[iVar2].m_data[0];
  pCVar3[iVar2].m_data[1] = dVar5 + pCVar3[iVar2].m_data[1];
  pCVar3[iVar2].m_data[2] = dVar11 + pCVar3[iVar2].m_data[2];
  piVar4 = (accumul->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4[iVar1] = piVar4[iVar1] + 1;
  piVar4[norm_indexes->m_data[1]] = piVar4[norm_indexes->m_data[1]] + 1;
  piVar4[norm_indexes->m_data[2]] = piVar4[norm_indexes->m_data[2]] + 1;
  return;
}

Assistant:

void TriangleNormalsCompute(ChVector<int> norm_indexes,
                            ChVector<int> vert_indexes,
                            std::vector<ChVector<>>& vertexes,
                            std::vector<ChVector<>>& normals,
                            std::vector<int>& accumul) {
    ChVector<> tnorm = Vcross(vertexes[vert_indexes.y()] - vertexes[vert_indexes.x()],
                              vertexes[vert_indexes.z()] - vertexes[vert_indexes.x()])
                           .GetNormalized();
    normals[norm_indexes.x()] += tnorm;
    normals[norm_indexes.y()] += tnorm;
    normals[norm_indexes.z()] += tnorm;
    accumul[norm_indexes.x()] += 1;
    accumul[norm_indexes.y()] += 1;
    accumul[norm_indexes.z()] += 1;
}